

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  kj::
  Table<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>::Callbacks>_>
  ::~Table(&(this->connections).table);
  kj::TaskSet::~TaskSet(&this->tasks);
  kj::Own<capnp::_::(anonymous_namespace)::RpcSystemBrand,_std::nullptr_t>::~Own(&this->brand);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->acceptLoopPromise);
  kj::_::NullableValue<kj::Function<kj::String_(const_kj::Exception_&)>_>::~NullableValue
            (&(this->traceEncoder).ptr);
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&(this->bootstrapInterface).ptr);
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }